

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::count_max_rep
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
          vector<int,_std::allocator<int>_> *space,int i0,int sub_i0)

{
  bool bVar1;
  pointer pIVar2;
  pointer pvVar3;
  pointer piVar4;
  pointer piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> *local_40;
  
  local_40 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)(this->inst).nsizes,&local_41);
  if (i0 < (this->inst).nsizes) {
    bVar1 = (this->inst).binary;
    pIVar2 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar3 = (this->weights).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (space->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar12 = (long)i0;
    do {
      iVar9 = 1;
      if (bVar1 == false) {
        iVar9 = pIVar2[lVar12].demand;
      }
      iVar10 = iVar9 - sub_i0;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (lVar12 != i0) {
        iVar10 = iVar9;
      }
      piVar4[lVar12] = iVar10;
      piVar6 = pIVar2[lVar12].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = *(pointer *)
                ((long)&pIVar2[lVar12].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl
                + 8);
      if (piVar6 != piVar7) {
        lVar8 = *(long *)&pvVar3[lVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        iVar9 = piVar4[lVar12];
        do {
          piVar11 = piVar6 + 1;
          iVar10 = piVar5[*piVar6] / *(int *)(lVar8 + (long)*piVar6 * 4);
          if (iVar10 < iVar9) {
            iVar9 = iVar10;
          }
          piVar4[lVar12] = iVar9;
        } while ((iVar9 != 0) && (piVar6 = piVar11, piVar11 != piVar7));
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->inst).nsizes);
  }
  return local_40;
}

Assistant:

std::vector<int> Arcflow::count_max_rep(const std::vector<int> &space, int i0 = 0,
										int sub_i0 = 0) const {
	std::vector<int> r(inst.nsizes);
	for (int i = i0; i < inst.nsizes; i++) {
		int dem = inst.binary ? 1 : sitems[i].demand;
		r[i] = i != i0 ? dem : std::max(0, dem - sub_i0);
		for (int d : sitems[i].nonzero) {
			r[i] = std::min(r[i], space[d] / weights[i][d]);
			if (!r[i]) {
				break;
			}
		}
	}
	return r;
}